

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O3

void __thiscall sf::Text::ensureGeometryUpdate(Text *this)

{
  VertexArray *this_00;
  VertexArray *this_01;
  String *this_02;
  Color *color;
  Color *color_00;
  float fVar1;
  float fVar2;
  uint uVar3;
  Vector2f position;
  byte bVar4;
  bool bVar5;
  Uint32 second;
  Texture *pTVar6;
  Glyph *pGVar7;
  size_t sVar8;
  size_t sVar9;
  Font *this_03;
  Uint32 first;
  float offset;
  float thickness;
  float offset_00;
  float fVar10;
  float fVar11;
  Vector2f position_00;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [104];
  undefined1 auVar14 [16];
  
  this_03 = this->m_font;
  if (this_03 != (Font *)0x0) {
    if (this->m_geometryNeedUpdate == false) {
      pTVar6 = Font::getTexture(this_03,this->m_characterSize);
      if (pTVar6->m_cacheId == this->m_fontTextureId) {
        return;
      }
      this_03 = this->m_font;
    }
    pTVar6 = Font::getTexture(this_03,this->m_characterSize);
    this->m_fontTextureId = pTVar6->m_cacheId;
    this->m_geometryNeedUpdate = false;
    this_00 = &this->m_vertices;
    VertexArray::clear(this_00);
    this_01 = &this->m_outlineVertices;
    VertexArray::clear(this_01);
    (this->m_bounds).left = 0.0;
    (this->m_bounds).top = 0.0;
    (this->m_bounds).width = 0.0;
    (this->m_bounds).height = 0.0;
    this_02 = &this->m_string;
    bVar5 = String::isEmpty(this_02);
    if (!bVar5) {
      uVar3 = this->m_style;
      bVar4 = (byte)uVar3;
      bVar5 = (bool)(bVar4 & 1);
      local_e8 = ZEXT816(0);
      fVar12 = 0.0;
      if ((uVar3 & 2) != 0) {
        fVar12 = 0.209;
      }
      offset = Font::getUnderlinePosition(this->m_font,this->m_characterSize);
      thickness = Font::getUnderlineThickness(this->m_font,this->m_characterSize);
      pGVar7 = Font::getGlyph(this->m_font,0x78,this->m_characterSize,bVar5,0.0);
      offset_00 = (pGVar7->bounds).height * 0.5 + (pGVar7->bounds).top;
      pGVar7 = Font::getGlyph(this->m_font,0x20,this->m_characterSize,bVar5,0.0);
      fVar16 = pGVar7->advance;
      fVar19 = this->m_letterSpacingFactor;
      fVar10 = Font::getLineSpacing(this->m_font,this->m_characterSize);
      fVar1 = this->m_lineSpacingFactor;
      local_a8._4_4_ = (undefined4)this->m_characterSize;
      local_f8 = ZEXT416((uint)local_a8._4_4_);
      sVar8 = String::getSize(this_02);
      local_a8._0_4_ = local_a8._4_4_;
      fStack_a0 = (float)local_a8._4_4_;
      fStack_9c = (float)local_a8._4_4_;
      if (sVar8 == 0) {
        local_98._0_8_ = 0;
      }
      else {
        fVar19 = (fVar19 + -1.0) * (fVar16 / 3.0);
        fVar16 = fVar16 + fVar19;
        color = &this->m_fillColor;
        color_00 = &this->m_outlineColor;
        first = 0;
        sVar8 = 0;
        local_e8 = ZEXT816(0);
        local_98._0_16_ = ZEXT816(0);
        do {
          second = String::operator[](this_02,sVar8);
          if (second != 0xd) {
            fVar11 = Font::getKerning(this->m_font,first,second,this->m_characterSize,bVar5);
            local_e8._0_4_ = (float)local_e8._0_4_ + fVar11;
            if ((first != 10 & bVar4 >> 2 & second == 10) == 1) {
              anon_unknown.dwarf_27fa2b::addLine
                        (this_00,(float)local_e8._0_4_,(float)local_f8._0_4_,color,offset,thickness,
                         0.0);
              fVar11 = this->m_outlineThickness;
              if ((fVar11 != 0.0) || (NAN(fVar11))) {
                anon_unknown.dwarf_27fa2b::addLine
                          (this_01,(float)local_e8._0_4_,(float)local_f8._0_4_,color_00,offset,
                           thickness,fVar11);
              }
            }
            if ((bVar4 >> 3 & first != 10 & second == 10) == 1) {
              anon_unknown.dwarf_27fa2b::addLine
                        (this_00,(float)local_e8._0_4_,(float)local_f8._0_4_,color,offset_00,
                         thickness,0.0);
              fVar11 = this->m_outlineThickness;
              if ((fVar11 != 0.0) || (NAN(fVar11))) {
                anon_unknown.dwarf_27fa2b::addLine
                          (this_01,(float)local_e8._0_4_,(float)local_f8._0_4_,color_00,offset_00,
                           thickness,fVar11);
              }
              auVar14._8_4_ = local_e8._4_4_;
              auVar14._0_8_ = local_e8._0_8_;
              auVar14._12_4_ = local_f8._4_4_;
              auVar13._8_8_ = auVar14._8_8_;
              auVar13._4_4_ = local_f8._0_4_;
              auVar13._0_4_ = local_e8._0_4_;
              _local_a8 = minps(auVar13,_local_a8);
LAB_0017a84f:
              auVar18 = ZEXT416((uint)((float)local_f8._0_4_ + fVar10 * fVar1)) << 0x20;
            }
            else {
              if ((0x20 < second) || ((0x100000600U >> ((ulong)second & 0x3f) & 1) == 0)) {
                fVar11 = this->m_outlineThickness;
                if ((fVar11 != 0.0) || (NAN(fVar11))) {
                  pGVar7 = Font::getGlyph(this->m_font,second,this->m_characterSize,bVar5,fVar11);
                  position_00.y = (float)local_f8._0_4_;
                  position_00.x = (float)local_e8._0_4_;
                  anon_unknown.dwarf_27fa2b::addGlyphQuad
                            (this_01,position_00,color_00,pGVar7,fVar12);
                }
                position.y = (float)local_f8._0_4_;
                position.x = (float)local_e8._0_4_;
                pGVar7 = Font::getGlyph(this->m_font,second,this->m_characterSize,bVar5,0.0);
                anon_unknown.dwarf_27fa2b::addGlyphQuad(this_00,position,color,pGVar7,fVar12);
                fVar11 = (pGVar7->bounds).left;
                fVar2 = (pGVar7->bounds).top;
                fVar21 = (pGVar7->bounds).height + fVar2;
                auVar22._0_4_ = -fVar12 * fVar21 + (float)local_e8._0_4_ + fVar11;
                auVar20._0_4_ =
                     -fVar12 * fVar2 + fVar11 + (pGVar7->bounds).width + (float)local_e8._0_4_;
                auVar22._4_4_ = fVar2 + (float)local_f8._0_4_;
                auVar22._8_4_ = 0x80000000;
                auVar22._12_4_ = 0;
                _local_a8 = minps(auVar22,_local_a8);
                auVar20._4_4_ = fVar21 + (float)local_f8._0_4_;
                auVar20._8_4_ = 0x80000000;
                auVar20._12_4_ = 0;
                local_98._0_16_ = maxps(auVar20,local_98._0_16_);
                local_e8._0_4_ = (float)local_e8._0_4_ + pGVar7->advance + fVar19;
                first = second;
                goto LAB_0017a887;
              }
              auVar17._4_4_ = local_e8._4_4_;
              auVar17._0_4_ = local_e8._0_4_;
              auVar17._8_4_ = local_e8._4_4_;
              auVar17._12_4_ = local_f8._4_4_;
              auVar18._8_8_ = auVar17._8_8_;
              auVar18._0_8_ = CONCAT44(local_f8._0_4_,local_e8._0_4_);
              auVar15._8_4_ = local_e8._4_4_;
              auVar15._0_8_ = auVar18._0_8_;
              auVar15._12_4_ = local_f8._4_4_;
              _local_a8 = minps(auVar15,_local_a8);
              if (second == 9) {
                auVar18._0_4_ = fVar16 * 4.0 + (float)local_e8._0_4_;
              }
              else {
                if (second == 10) goto LAB_0017a84f;
                if (second == 0x20) {
                  auVar18._0_4_ = (float)local_e8._0_4_ + fVar16;
                }
              }
            }
            local_f8._4_4_ = auVar18._4_4_;
            local_98._0_16_ = maxps(auVar18,local_98._0_16_);
            local_f8._0_4_ = local_f8._4_4_;
            local_f8._8_4_ = local_f8._4_4_;
            local_f8._12_4_ = local_f8._4_4_;
            first = second;
            local_e8 = auVar18;
          }
LAB_0017a887:
          sVar8 = sVar8 + 1;
          sVar9 = String::getSize(this_02);
        } while (sVar8 < sVar9);
      }
      fVar12 = this->m_outlineThickness;
      if ((fVar12 != 0.0) || (NAN(fVar12))) {
        fVar12 = ceilf(fVar12);
        local_a8._4_4_ = (float)local_a8._4_4_ - ABS(fVar12);
        local_a8._0_4_ = (float)local_a8._0_4_ - ABS(fVar12);
        local_98._4_4_ = (float)local_98._4_4_ + ABS(fVar12);
        local_98._0_4_ = (float)local_98._0_4_ + ABS(fVar12);
      }
      if (((uVar3 & 4) != 0) && (0.0 < (float)local_e8._0_4_)) {
        anon_unknown.dwarf_27fa2b::addLine
                  (this_00,(float)local_e8._0_4_,(float)local_f8._0_4_,&this->m_fillColor,offset,
                   thickness,0.0);
        fVar12 = this->m_outlineThickness;
        if ((fVar12 != 0.0) || (NAN(fVar12))) {
          anon_unknown.dwarf_27fa2b::addLine
                    (this_01,(float)local_e8._0_4_,(float)local_f8._0_4_,&this->m_outlineColor,
                     offset,thickness,fVar12);
        }
      }
      if (((uVar3 & 8) != 0) && (0.0 < (float)local_e8._0_4_)) {
        anon_unknown.dwarf_27fa2b::addLine
                  (this_00,(float)local_e8._0_4_,(float)local_f8._0_4_,&this->m_fillColor,offset_00,
                   thickness,0.0);
        fVar12 = this->m_outlineThickness;
        if ((fVar12 != 0.0) || (NAN(fVar12))) {
          anon_unknown.dwarf_27fa2b::addLine
                    (this_01,(float)local_e8._0_4_,(float)local_f8._0_4_,&this->m_outlineColor,
                     offset_00,thickness,fVar12);
        }
      }
      (this->m_bounds).left = (float)local_a8._0_4_;
      (this->m_bounds).top = (float)local_a8._4_4_;
      (this->m_bounds).width = (float)local_98._0_4_ - (float)local_a8._0_4_;
      (this->m_bounds).height = (float)local_98._4_4_ - (float)local_a8._4_4_;
    }
  }
  return;
}

Assistant:

void Text::ensureGeometryUpdate() const
{
    if (!m_font)
        return;

    // Do nothing, if geometry has not changed and the font texture has not changed
    if (!m_geometryNeedUpdate && m_font->getTexture(m_characterSize).m_cacheId == m_fontTextureId)
        return;

    // Save the current fonts texture id
    m_fontTextureId = m_font->getTexture(m_characterSize).m_cacheId;

    // Mark geometry as updated
    m_geometryNeedUpdate = false;

    // Clear the previous geometry
    m_vertices.clear();
    m_outlineVertices.clear();
    m_bounds = FloatRect();

    // No text: nothing to draw
    if (m_string.isEmpty())
        return;

    // Compute values related to the text style
    bool  isBold             = m_style & Bold;
    bool  isUnderlined       = m_style & Underlined;
    bool  isStrikeThrough    = m_style & StrikeThrough;
    float italicShear        = (m_style & Italic) ? 0.209f : 0.f; // 12 degrees in radians
    float underlineOffset    = m_font->getUnderlinePosition(m_characterSize);
    float underlineThickness = m_font->getUnderlineThickness(m_characterSize);

    // Compute the location of the strike through dynamically
    // We use the center point of the lowercase 'x' glyph as the reference
    // We reuse the underline thickness as the thickness of the strike through as well
    FloatRect xBounds = m_font->getGlyph(L'x', m_characterSize, isBold).bounds;
    float strikeThroughOffset = xBounds.top + xBounds.height / 2.f;

    // Precompute the variables needed by the algorithm
    float whitespaceWidth = m_font->getGlyph(L' ', m_characterSize, isBold).advance;
    float letterSpacing   = ( whitespaceWidth / 3.f ) * ( m_letterSpacingFactor - 1.f );
    whitespaceWidth      += letterSpacing;
    float lineSpacing     = m_font->getLineSpacing(m_characterSize) * m_lineSpacingFactor;
    float x               = 0.f;
    float y               = static_cast<float>(m_characterSize);

    // Create one quad for each character
    float minX = static_cast<float>(m_characterSize);
    float minY = static_cast<float>(m_characterSize);
    float maxX = 0.f;
    float maxY = 0.f;
    Uint32 prevChar = 0;
    for (std::size_t i = 0; i < m_string.getSize(); ++i)
    {
        Uint32 curChar = m_string[i];

        // Skip the \r char to avoid weird graphical issues
        if (curChar == L'\r')
            continue;

        // Apply the kerning offset
        x += m_font->getKerning(prevChar, curChar, m_characterSize, isBold);

        // If we're using the underlined style and there's a new line, draw a line
        if (isUnderlined && (curChar == L'\n' && prevChar != L'\n'))
        {
            addLine(m_vertices, x, y, m_fillColor, underlineOffset, underlineThickness);

            if (m_outlineThickness != 0)
                addLine(m_outlineVertices, x, y, m_outlineColor, underlineOffset, underlineThickness, m_outlineThickness);
        }

        // If we're using the strike through style and there's a new line, draw a line across all characters
        if (isStrikeThrough && (curChar == L'\n' && prevChar != L'\n'))
        {
            addLine(m_vertices, x, y, m_fillColor, strikeThroughOffset, underlineThickness);

            if (m_outlineThickness != 0)
                addLine(m_outlineVertices, x, y, m_outlineColor, strikeThroughOffset, underlineThickness, m_outlineThickness);
        }

        prevChar = curChar;

        // Handle special characters
        if ((curChar == L' ') || (curChar == L'\n') || (curChar == L'\t'))
        {
            // Update the current bounds (min coordinates)
            minX = std::min(minX, x);
            minY = std::min(minY, y);

            switch (curChar)
            {
                case L' ':  x += whitespaceWidth;     break;
                case L'\t': x += whitespaceWidth * 4; break;
                case L'\n': y += lineSpacing; x = 0;  break;
            }

            // Update the current bounds (max coordinates)
            maxX = std::max(maxX, x);
            maxY = std::max(maxY, y);

            // Next glyph, no need to create a quad for whitespace
            continue;
        }

        // Apply the outline
        if (m_outlineThickness != 0)
        {
            const Glyph& glyph = m_font->getGlyph(curChar, m_characterSize, isBold, m_outlineThickness);

            // Add the outline glyph to the vertices
            addGlyphQuad(m_outlineVertices, Vector2f(x, y), m_outlineColor, glyph, italicShear);
        }

        // Extract the current glyph's description
        const Glyph& glyph = m_font->getGlyph(curChar, m_characterSize, isBold);

        // Add the glyph to the vertices
        addGlyphQuad(m_vertices, Vector2f(x, y), m_fillColor, glyph, italicShear);

        // Update the current bounds
        float left   = glyph.bounds.left;
        float top    = glyph.bounds.top;
        float right  = glyph.bounds.left + glyph.bounds.width;
        float bottom = glyph.bounds.top + glyph.bounds.height;

        minX = std::min(minX, x + left - italicShear * bottom);
        maxX = std::max(maxX, x + right - italicShear * top);
        minY = std::min(minY, y + top);
        maxY = std::max(maxY, y + bottom);

        // Advance to the next character
        x += glyph.advance + letterSpacing;
    }

    // If we're using outline, update the current bounds
    if (m_outlineThickness != 0)
    {
        float outline = std::abs(std::ceil(m_outlineThickness));
        minX -= outline;
        maxX += outline;
        minY -= outline;
        maxY += outline;
    }

    // If we're using the underlined style, add the last line
    if (isUnderlined && (x > 0))
    {
        addLine(m_vertices, x, y, m_fillColor, underlineOffset, underlineThickness);

        if (m_outlineThickness != 0)
            addLine(m_outlineVertices, x, y, m_outlineColor, underlineOffset, underlineThickness, m_outlineThickness);
    }

    // If we're using the strike through style, add the last line across all characters
    if (isStrikeThrough && (x > 0))
    {
        addLine(m_vertices, x, y, m_fillColor, strikeThroughOffset, underlineThickness);

        if (m_outlineThickness != 0)
            addLine(m_outlineVertices, x, y, m_outlineColor, strikeThroughOffset, underlineThickness, m_outlineThickness);
    }

    // Update the bounding rectangle
    m_bounds.left = minX;
    m_bounds.top = minY;
    m_bounds.width = maxX - minX;
    m_bounds.height = maxY - minY;
}